

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_input.cpp
# Opt level: O2

bool Omega_h::handle_one_include(InputList *list)

{
  bool bVar1;
  InputList *list_00;
  InputMap *map;
  LO i;
  int i_00;
  int iVar2;
  
  for (i_00 = 0;
      iVar2 = (int)((ulong)((long)(list->entries).
                                  super__Vector_base<std::shared_ptr<Omega_h::Input>,_std::allocator<std::shared_ptr<Omega_h::Input>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(list->entries).
                                 super__Vector_base<std::shared_ptr<Omega_h::Input>,_std::allocator<std::shared_ptr<Omega_h::Input>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4), i_00 < iVar2;
      i_00 = i_00 + 1) {
    bVar1 = InputList::is_input<Omega_h::InputList>(list,i_00);
    if (bVar1) {
      list_00 = InputList::use_input<Omega_h::InputList>(list,i_00);
      bVar1 = handle_one_include(list_00);
LAB_002aa086:
      if (bVar1 != false) break;
    }
    else {
      bVar1 = InputList::is_input<Omega_h::InputMap>(list,i_00);
      if (bVar1) {
        map = InputList::use_input<Omega_h::InputMap>(list,i_00);
        bVar1 = handle_one_include(map);
        goto LAB_002aa086;
      }
    }
  }
  return i_00 < iVar2;
}

Assistant:

static bool handle_one_include(InputList& list) {
  for (LO i = 0; i < list.size(); ++i) {
    if (list.is_list(i)) {
      if (handle_one_include(list.get_list(i))) return true;
    } else if (list.is_map(i)) {
      if (handle_one_include(list.get_map(i))) return true;
    }
  }
  return false;
}